

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool Assimp::PLY::DOM::SkipLine(vector<char,_std::allocator<char>_> *buffer)

{
  char cVar1;
  pointer __dest;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  
  __dest = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (__dest == (pointer)0x0 || __dest == pcVar2) {
    bVar4 = false;
  }
  else {
    lVar3 = 0;
    while ((0xd < (byte)__dest[lVar3] || ((0x2401U >> ((byte)__dest[lVar3] & 0x1f) & 1) == 0))) {
      lVar3 = lVar3 + 1;
    }
    while( true ) {
      cVar1 = __dest[lVar3];
      if ((cVar1 != '\r') && (cVar1 != '\n')) break;
      lVar3 = lVar3 + 1;
    }
    bVar4 = cVar1 != '\0';
    if (lVar3 != 0) {
      if (__dest + lVar3 != pcVar2) {
        memmove(__dest,__dest + lVar3,(size_t)(pcVar2 + (-lVar3 - (long)__dest)));
      }
      if (lVar3 != 0) {
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish + -lVar3;
      }
    }
  }
  return bVar4;
}

Assistant:

bool PLY::DOM::SkipLine(std::vector<char> &buffer)
{
  const char* pCur = buffer.empty() ? NULL : (char*)&buffer[0];
  bool ret = false;
  if (pCur)
  {
    const char* szCur = pCur;
    ret = Assimp::SkipLine(pCur, &pCur);

    uintptr_t iDiff = (uintptr_t)pCur - (uintptr_t)szCur;
    buffer.erase(buffer.begin(), buffer.begin() + iDiff);
    return ret;
  }

  return ret;
}